

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_std_unsetenv(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val1;
  undefined1 auVar1 [16];
  char *__name;
  undefined4 in_ECX;
  char *in_R8;
  char *name;
  JSValueUnion in_stack_ffffffffffffffb8;
  int64_t in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uStack_c;
  undefined8 local_8;
  
  val1.tag = in_stack_ffffffffffffffc0;
  val1.u.float64 = in_stack_ffffffffffffffb8.float64;
  __name = JS_ToCString((JSContext *)0x110b42,val1);
  if (__name == (char *)0x0) {
    local_8 = 6;
  }
  else {
    unsetenv(__name);
    JS_FreeCString((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),in_R8);
    local_8 = 3;
  }
  auVar1._4_8_ = local_8;
  auVar1._0_4_ = uStack_c;
  auVar1._12_4_ = 0;
  return (JSValue)(auVar1 << 0x20);
}

Assistant:

static JSValue js_std_unsetenv(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv)
{
    const char *name;
    name = JS_ToCString(ctx, argv[0]);
    if (!name)
        return JS_EXCEPTION;
    unsetenv(name);
    JS_FreeCString(ctx, name);
    return JS_UNDEFINED;
}